

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int mbedtls_x509_crt_info(char *buf,size_t size,char *prefix,mbedtls_x509_crt *crt)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong __maxlen;
  ulong uVar9;
  char *pcVar10;
  bool bVar11;
  char *local_68;
  ulong local_60;
  mbedtls_pk_context *local_58;
  ulong local_50;
  char key_size_str [18];
  
  if (crt == (mbedtls_x509_crt *)0x0) {
    uVar1 = snprintf(buf,size,"\nCertificate is uninitialised!\n");
    uVar2 = 0xffffd680;
    if (uVar1 < size) {
      uVar2 = uVar1;
    }
    if ((int)uVar1 < 0) {
      uVar2 = 0xffffd680;
    }
  }
  else {
    uVar1 = snprintf(buf,size,"%scert. version     : %d\n",prefix,(ulong)(uint)crt->version);
    uVar6 = 0xffffd680;
    uVar2 = uVar6;
    if (-1 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
      uVar7 = size - uVar9;
      if (uVar9 <= size && uVar7 != 0) {
        pcVar10 = buf + uVar9;
        uVar1 = snprintf(pcVar10,uVar7,"%sserial number     : ",prefix);
        if (-1 < (int)uVar1) {
          uVar9 = (ulong)uVar1;
          uVar8 = uVar7 - uVar9;
          if (uVar9 <= uVar7 && uVar8 != 0) {
            pcVar10 = pcVar10 + uVar9;
            uVar1 = mbedtls_x509_serial_gets(pcVar10,uVar8,&crt->serial);
            if (-1 < (int)uVar1) {
              uVar9 = (ulong)uVar1;
              uVar7 = uVar8 - uVar9;
              if (uVar9 <= uVar8 && uVar7 != 0) {
                pcVar10 = pcVar10 + uVar9;
                uVar1 = snprintf(pcVar10,uVar7,"\n%sissuer name       : ",prefix);
                if (-1 < (int)uVar1) {
                  uVar9 = (ulong)uVar1;
                  uVar8 = uVar7 - uVar9;
                  if (uVar9 <= uVar7 && uVar8 != 0) {
                    pcVar10 = pcVar10 + uVar9;
                    uVar1 = mbedtls_x509_dn_gets(pcVar10,uVar8,&crt->issuer);
                    if (-1 < (int)uVar1) {
                      uVar9 = (ulong)uVar1;
                      uVar7 = uVar8 - uVar9;
                      if (uVar9 <= uVar8 && uVar7 != 0) {
                        pcVar10 = pcVar10 + uVar9;
                        uVar1 = snprintf(pcVar10,uVar7,"\n%ssubject name      : ",prefix);
                        if (-1 < (int)uVar1) {
                          uVar9 = (ulong)uVar1;
                          uVar8 = uVar7 - uVar9;
                          if (uVar9 <= uVar7 && uVar8 != 0) {
                            uVar1 = mbedtls_x509_dn_gets(pcVar10 + uVar9,uVar8,&crt->subject);
                            if (-1 < (int)uVar1) {
                              uVar7 = (ulong)uVar1;
                              __maxlen = uVar8 - uVar7;
                              if (uVar7 <= uVar8 && __maxlen != 0) {
                                pcVar10 = pcVar10 + uVar9 + uVar7;
                                local_50 = (ulong)(uint)(crt->valid_from).day;
                                local_58 = (mbedtls_pk_context *)(ulong)(uint)(crt->valid_from).hour
                                ;
                                local_68 = pcVar10;
                                local_60 = __maxlen;
                                uVar1 = snprintf(pcVar10,__maxlen,
                                                 "\n%sissued  on        : %04d-%02d-%02d %02d:%02d:%02d"
                                                 ,prefix,(ulong)(uint)(crt->valid_from).year,
                                                 (ulong)(uint)(crt->valid_from).mon,local_50,
                                                 local_58,(ulong)(uint)(crt->valid_from).min,
                                                 (ulong)(uint)(crt->valid_from).sec);
                                if (-1 < (int)uVar1) {
                                  uVar9 = (ulong)uVar1;
                                  uVar7 = __maxlen - uVar9;
                                  if (uVar9 <= __maxlen && uVar7 != 0) {
                                    pcVar10 = pcVar10 + uVar9;
                                    local_50 = (ulong)(uint)(crt->valid_to).day;
                                    local_58 = (mbedtls_pk_context *)
                                               (ulong)(uint)(crt->valid_to).hour;
                                    uVar1 = snprintf(pcVar10,uVar7,
                                                                                                          
                                                  "\n%sexpires on        : %04d-%02d-%02d %02d:%02d:%02d"
                                                  ,prefix,(ulong)(uint)(crt->valid_to).year,
                                                  (ulong)(uint)(crt->valid_to).mon,local_50,local_58
                                                  ,(ulong)(uint)(crt->valid_to).min,
                                                  (ulong)(uint)(crt->valid_to).sec);
                                    if (-1 < (int)uVar1) {
                                      uVar9 = (ulong)uVar1;
                                      uVar8 = uVar7 - uVar9;
                                      if (uVar9 <= uVar7 && uVar8 != 0) {
                                        pcVar10 = pcVar10 + uVar9;
                                        uVar1 = snprintf(pcVar10,uVar8,"\n%ssigned using      : ",
                                                         prefix);
                                        if (-1 < (int)uVar1) {
                                          uVar9 = (ulong)uVar1;
                                          uVar7 = uVar8 - uVar9;
                                          if (uVar9 <= uVar8 && uVar7 != 0) {
                                            pcVar10 = pcVar10 + uVar9;
                                            uVar1 = mbedtls_x509_sig_alg_gets
                                                              (pcVar10,uVar7,&crt->sig_oid,
                                                               crt->sig_pk,crt->sig_md,crt->sig_opts
                                                              );
                                            if (-1 < (int)uVar1) {
                                              local_50 = (ulong)uVar1;
                                              uVar9 = uVar7 - local_50;
                                              if (local_50 <= uVar7 && uVar9 != 0) {
                                                local_58 = &crt->pk;
                                                pcVar4 = mbedtls_pk_get_name(local_58);
                                                uVar2 = mbedtls_x509_key_size_helper
                                                                  (key_size_str,0x12,pcVar4);
                                                if (uVar2 == 0) {
                                                  pcVar10 = pcVar10 + local_50;
                                                  sVar5 = mbedtls_pk_get_bitlen(local_58);
                                                  uVar1 = snprintf(pcVar10,uVar9,
                                                                   "\n%s%-18s: %d bits",prefix,
                                                                   key_size_str,sVar5 & 0xffffffff);
                                                  uVar2 = uVar6;
                                                  if (-1 < (int)uVar1) {
                                                    uVar8 = (ulong)uVar1;
                                                    uVar7 = uVar9 - uVar8;
                                                    if (uVar8 <= uVar9 && uVar7 != 0) {
                                                      pcVar10 = pcVar10 + uVar8;
                                                      if ((crt->ext_types & 0x100) != 0) {
                                                        pcVar4 = "true";
                                                        if (crt->ca_istrue == 0) {
                                                          pcVar4 = "false";
                                                        }
                                                        uVar2 = snprintf(pcVar10,uVar7,
                                                                                                                                                  
                                                  "\n%sbasic constraints : CA=%s",prefix,pcVar4);
                                                  if ((int)uVar2 < 0) {
                                                    return -0x2980;
                                                  }
                                                  uVar9 = (ulong)uVar2;
                                                  bVar11 = uVar7 < uVar9;
                                                  uVar7 = uVar7 - uVar9;
                                                  if (bVar11 || uVar7 == 0) {
                                                    return -0x2980;
                                                  }
                                                  pcVar10 = pcVar10 + uVar9;
                                                  if (0 < crt->max_pathlen) {
                                                    uVar2 = snprintf(pcVar10,uVar7,
                                                                     ", max_pathlen=%d",
                                                                     (ulong)(crt->max_pathlen - 1));
                                                    if ((int)uVar2 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar9 = (ulong)uVar2;
                                                    bVar11 = uVar7 < uVar9;
                                                    uVar7 = uVar7 - uVar9;
                                                    if (bVar11 || uVar7 == 0) {
                                                      return -0x2980;
                                                    }
                                                    pcVar10 = pcVar10 + uVar9;
                                                  }
                                                  }
                                                  uVar2 = crt->ext_types;
                                                  if ((uVar2 & 0x20) != 0) {
                                                    uVar2 = snprintf(pcVar10,uVar7,
                                                                     "\n%ssubject alt name  : ",
                                                                     prefix);
                                                    if ((int)uVar2 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar9 = (ulong)uVar2;
                                                    local_60 = uVar7 - uVar9;
                                                    if (uVar7 < uVar9 || local_60 == 0) {
                                                      return -0x2980;
                                                    }
                                                    local_68 = pcVar10 + uVar9;
                                                    iVar3 = x509_info_subject_alt_name
                                                                      (&local_68,&local_60,
                                                                       &crt->subject_alt_names);
                                                    if (iVar3 != 0) {
                                                      return iVar3;
                                                    }
                                                    uVar2 = crt->ext_types;
                                                    uVar7 = local_60;
                                                    pcVar10 = local_68;
                                                  }
                                                  if ((uVar2 >> 0x10 & 1) != 0) {
                                                    uVar2 = snprintf(pcVar10,uVar7,
                                                                     "\n%scert. type        : ",
                                                                     prefix);
                                                    if ((int)uVar2 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar9 = (ulong)uVar2;
                                                    local_60 = uVar7 - uVar9;
                                                    if (uVar7 < uVar9 || local_60 == 0) {
                                                      return -0x2980;
                                                    }
                                                    local_68 = pcVar10 + uVar9;
                                                    iVar3 = x509_info_cert_type(&local_68,&local_60,
                                                                                crt->ns_cert_type);
                                                    if (iVar3 != 0) {
                                                      return iVar3;
                                                    }
                                                    uVar2 = crt->ext_types;
                                                    uVar7 = local_60;
                                                    pcVar10 = local_68;
                                                  }
                                                  if ((uVar2 & 4) != 0) {
                                                    uVar2 = snprintf(pcVar10,uVar7,
                                                                     "\n%skey usage         : ",
                                                                     prefix);
                                                    if ((int)uVar2 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar9 = (ulong)uVar2;
                                                    local_60 = uVar7 - uVar9;
                                                    if (uVar7 < uVar9 || local_60 == 0) {
                                                      return -0x2980;
                                                    }
                                                    local_68 = pcVar10 + uVar9;
                                                    iVar3 = x509_info_key_usage(&local_68,&local_60,
                                                                                crt->key_usage);
                                                    if (iVar3 != 0) {
                                                      return iVar3;
                                                    }
                                                    uVar2 = crt->ext_types;
                                                    uVar7 = local_60;
                                                    pcVar10 = local_68;
                                                  }
                                                  if ((uVar2 >> 0xb & 1) != 0) {
                                                    uVar2 = snprintf(pcVar10,uVar7,
                                                                     "\n%sext key usage     : ",
                                                                     prefix);
                                                    if ((int)uVar2 < 0) {
                                                      return -0x2980;
                                                    }
                                                    uVar9 = (ulong)uVar2;
                                                    local_60 = uVar7 - uVar9;
                                                    if (uVar7 < uVar9 || local_60 == 0) {
                                                      return -0x2980;
                                                    }
                                                    local_68 = pcVar10 + uVar9;
                                                    iVar3 = x509_info_ext_key_usage
                                                                      (&local_68,&local_60,
                                                                       &crt->ext_key_usage);
                                                    uVar7 = local_60;
                                                    pcVar10 = local_68;
                                                    if (iVar3 != 0) {
                                                      return iVar3;
                                                    }
                                                  }
                                                  uVar1 = snprintf(pcVar10,uVar7,
                                                                   anon_var_dwarf_2e7e9 + 8);
                                                  uVar2 = uVar6;
                                                  if ((-1 < (int)uVar1) && (uVar1 < uVar7)) {
                                                    uVar2 = (int)size + (uVar1 - (int)uVar7);
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int mbedtls_x509_crt_info( char *buf, size_t size, const char *prefix,
                   const mbedtls_x509_crt *crt )
{
    int ret;
    size_t n;
    char *p;
    char key_size_str[BEFORE_COLON];

    p = buf;
    n = size;

    if( NULL == crt )
    {
        ret = mbedtls_snprintf( p, n, "\nCertificate is uninitialised!\n" );
        MBEDTLS_X509_SAFE_SNPRINTF;

        return( (int) ( size - n ) );
    }

    ret = mbedtls_snprintf( p, n, "%scert. version     : %d\n",
                               prefix, crt->version );
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_snprintf( p, n, "%sserial number     : ",
                               prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_serial_gets( p, n, &crt->serial );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%sissuer name       : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets( p, n, &crt->issuer  );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%ssubject name      : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets( p, n, &crt->subject );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%sissued  on        : " \
                   "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                   crt->valid_from.year, crt->valid_from.mon,
                   crt->valid_from.day,  crt->valid_from.hour,
                   crt->valid_from.min,  crt->valid_from.sec );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%sexpires on        : " \
                   "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                   crt->valid_to.year, crt->valid_to.mon,
                   crt->valid_to.day,  crt->valid_to.hour,
                   crt->valid_to.min,  crt->valid_to.sec );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%ssigned using      : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_sig_alg_gets( p, n, &crt->sig_oid, crt->sig_pk,
                             crt->sig_md, crt->sig_opts );
    MBEDTLS_X509_SAFE_SNPRINTF;

    /* Key size */
    if( ( ret = mbedtls_x509_key_size_helper( key_size_str, BEFORE_COLON,
                                      mbedtls_pk_get_name( &crt->pk ) ) ) != 0 )
    {
        return( ret );
    }

    ret = mbedtls_snprintf( p, n, "\n%s%-" BC "s: %d bits", prefix, key_size_str,
                          (int) mbedtls_pk_get_bitlen( &crt->pk ) );
    MBEDTLS_X509_SAFE_SNPRINTF;

    /*
     * Optional extensions
     */

    if( crt->ext_types & MBEDTLS_X509_EXT_BASIC_CONSTRAINTS )
    {
        ret = mbedtls_snprintf( p, n, "\n%sbasic constraints : CA=%s", prefix,
                        crt->ca_istrue ? "true" : "false" );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( crt->max_pathlen > 0 )
        {
            ret = mbedtls_snprintf( p, n, ", max_pathlen=%d", crt->max_pathlen - 1 );
            MBEDTLS_X509_SAFE_SNPRINTF;
        }
    }

    if( crt->ext_types & MBEDTLS_X509_EXT_SUBJECT_ALT_NAME )
    {
        ret = mbedtls_snprintf( p, n, "\n%ssubject alt name  : ", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( ( ret = x509_info_subject_alt_name( &p, &n,
                                            &crt->subject_alt_names ) ) != 0 )
            return( ret );
    }

    if( crt->ext_types & MBEDTLS_X509_EXT_NS_CERT_TYPE )
    {
        ret = mbedtls_snprintf( p, n, "\n%scert. type        : ", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( ( ret = x509_info_cert_type( &p, &n, crt->ns_cert_type ) ) != 0 )
            return( ret );
    }

    if( crt->ext_types & MBEDTLS_X509_EXT_KEY_USAGE )
    {
        ret = mbedtls_snprintf( p, n, "\n%skey usage         : ", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( ( ret = x509_info_key_usage( &p, &n, crt->key_usage ) ) != 0 )
            return( ret );
    }

    if( crt->ext_types & MBEDTLS_X509_EXT_EXTENDED_KEY_USAGE )
    {
        ret = mbedtls_snprintf( p, n, "\n%sext key usage     : ", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        if( ( ret = x509_info_ext_key_usage( &p, &n,
                                             &crt->ext_key_usage ) ) != 0 )
            return( ret );
    }

    ret = mbedtls_snprintf( p, n, "\n" );
    MBEDTLS_X509_SAFE_SNPRINTF;

    return( (int) ( size - n ) );
}